

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::BuiltinPrecisionTests::VariableStatement<float>::doExecute
          (VariableStatement<float> *this,EvalContext *ctx)

{
  Environment *pEVar1;
  Variable<float> *pVVar2;
  Expr<float> *pEVar3;
  IVal *pIVar4;
  IVal local_48;
  IVal local_30;
  EvalContext *local_18;
  EvalContext *ctx_local;
  VariableStatement<float> *this_local;
  
  local_18 = ctx;
  ctx_local = (EvalContext *)this;
  if ((this->m_isDeclaration & 1U) == 0) {
    pEVar3 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::operator->
                       ((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> *)
                        &this->m_value);
    Expr<float>::evaluate(&local_48,pEVar3,local_18);
    pEVar1 = local_18->env;
    pVVar2 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>::operator*
                       (&(this->m_variable).
                         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>);
    pIVar4 = Environment::lookup<float>(pEVar1,pVVar2);
    pIVar4->m_hasNaN = local_48.m_hasNaN;
    *(undefined7 *)&pIVar4->field_0x1 = local_48._1_7_;
    pIVar4->m_lo = local_48.m_lo;
    pIVar4->m_hi = local_48.m_hi;
  }
  else {
    pEVar1 = ctx->env;
    pVVar2 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>::operator*
                       (&(this->m_variable).
                         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>);
    pEVar3 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::operator->
                       ((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> *)
                        &this->m_value);
    Expr<float>::evaluate(&local_30,pEVar3,local_18);
    Environment::bind<float>(pEVar1,pVVar2,&local_30);
  }
  return;
}

Assistant:

void			doExecute			(EvalContext& ctx)						const
	{
		if (m_isDeclaration)
			ctx.env.bind(*m_variable, m_value->evaluate(ctx));
		else
			ctx.env.lookup(*m_variable) = m_value->evaluate(ctx);
	}